

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Btree_multimap_pair_Test::TestBody(Btree_multimap_pair_Test *this)

{
  undefined1 auVar1 [16];
  btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *pbVar2;
  PropagatingCountingAlloc<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  PVar3;
  PropagatingCountingAlloc<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  PVar4;
  bool bVar5;
  byte bVar6;
  pointer p;
  pointer p_00;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
  *pbVar7;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
  *this_00;
  slot_type *args;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *values;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *values_00;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *values_01;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *values_02;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *values_03;
  const_pointer hint;
  const_pointer hint_00;
  size_type n;
  size_type n_00;
  uint uVar8;
  int i;
  int iVar9;
  size_type n_01;
  size_type i_00;
  int in_R8D;
  pair<int,_int> pVar10;
  uint uVar11;
  undefined1 *this_01;
  const_iterator cVar12;
  iterator iVar13;
  iterator iter;
  AssertHelper local_140;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_138;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  duplicate_values;
  int64_t original_bytes1;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  identical_values;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  random_values;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  sorted_values;
  multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  container;
  int64_t bytes2;
  pair<int,_int> local_68;
  PropagatingCountingAlloc<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  allocator1;
  
  duplicate_values.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       duplicate_values.
       super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (anonymous_namespace)::
  ConstTest<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>
            ();
  GenerateValuesWithSeed<std::pair<std::pair<int,int>,std::pair<int,int>>>
            (&random_values,(priv *)0x2710,40000,testing::FLAGS_gtest_random_seed,in_R8D);
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .const_tree_ = (btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  *)&container;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .tree_.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
        )btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
         ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .tree_.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .tree_.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
       ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .tree_.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .tree_.size_ = 0;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &container.
        super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
        .checker_._M_t._M_impl.super__Rb_tree_header._M_header;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       container.
       super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
       .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::vector(&sorted_values,&random_values);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (sorted_values.
             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             sorted_values.
             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>,std::pair<std::pair<int,int>,std::pair<int,int>>>
            ((char *)&container,
             (multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *)&sorted_values,values);
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>>
            (sorted_values.
             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             sorted_values.
             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>,std::pair<std::pair<int,int>,std::pair<int,int>>>
            ((char *)&container,
             (multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *)&sorted_values,values_00);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>,std::pair<std::pair<int,int>,std::pair<int,int>>>
            ((char *)&container,
             (multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *)&random_values,values_01);
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::vector(&duplicate_values,&random_values);
  std::
  vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>const*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>,void>
            ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
              *)&duplicate_values,
             (const_iterator)
             duplicate_values.
             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              )random_values.
               super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              )random_values.
               super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>,std::pair<std::pair<int,int>,std::pair<int,int>>>
            ((char *)&container,
             (multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *)&duplicate_values,values_02);
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::vector(&identical_values,100,(allocator_type *)&bytes2);
  allocator1.
  super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .bytes_used_ = (CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                  )&DAT_200000002;
  _bytes2 = Generator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>::operator()
                      ((Generator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_> *)
                       &allocator1,2);
  std::
  __fill_a1<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::pair<std::pair<int,int>,std::pair<int,int>>>
            (identical_values.
             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             identical_values.
             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)&bytes2);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multimap<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>,std::multimap<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>>,std::pair<std::pair<int,int>,std::pair<int,int>>>
            ((char *)&container,
             (multi_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              *)&identical_values,values_03);
  std::
  _Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~_Vector_base(&identical_values.
                   super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                 );
  std::
  _Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~_Vector_base(&duplicate_values.
                   super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                 );
  std::
  _Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~_Vector_base(&sorted_values.
                   super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                 );
  base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  ::~base_checker(&container.
                   super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                 );
  std::
  _Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~_Vector_base(&random_values.
                   super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                 );
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .tree_.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
        )(_Tuple_impl<1UL,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
          )0x0;
  n_01 = 0;
  Generator<std::pair<int,_int>_>::operator()((Generator<std::pair<int,_int>_> *)&container,0);
  identical_values.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  auVar1._8_8_ = 0;
  auVar1._0_4_ = local_68.first;
  auVar1._4_4_ = local_68.second;
  _bytes2 = (pair<std::pair<int,_int>,_std::pair<int,_int>_>)(auVar1 << 0x40);
  sorted_values.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e8000003e8;
  sorted_values.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3e8000003e8;
  allocator2.
  super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .bytes_used_ = (CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                  )(CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                    )&bytes2;
  allocator1.
  super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .bytes_used_ = (CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                  )(CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                    )&identical_values;
  p = CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
      ::allocate(&allocator1.
                  super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                 ,n_01,hint);
  p_00 = CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
         ::allocate(&allocator2.
                     super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                    ,n_01,hint_00);
  this_01 = btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
            ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .tree_.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
        )btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
         ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .tree_.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .tree_.size_ = (size_type)
                 btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                 ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .const_tree_ = (btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  *)0x0;
  random_values.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                ::EmptyNode()::empty_node;
  random_values.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                ::EmptyNode()::empty_node;
  original_bytes1 =
       (int64_t)identical_values.
                super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  random_values.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&bytes2;
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .tree_.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .tree_.rightmost_ = (node_type *)&identical_values;
  duplicate_values.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ =
       Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>::operator()
                 ((Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_> *)
                  &sorted_values,0);
  btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
            *)&container,(value_type *)&duplicate_values);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&duplicate_values,"bytes1","original_bytes1",(long *)&identical_values,
             &original_bytes1);
  if ((char)duplicate_values.
            super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_138);
    if (duplicate_values.
        super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pVar10 = (pair<int,_int>)0x415b6f;
    }
    else {
      pVar10 = (duplicate_values.
                super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->first;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,(char *)pVar10);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&duplicate_values.
                    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
  ::clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
           *)&container);
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .tree_.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .tree_.rightmost_ = (node_type *)&bytes2;
  if (container.
      super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
      .const_tree_ !=
      (btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
       *)0x0) {
    __assert_fail("empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x9a5,
                  "void phmap::priv::btree<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>::copy_or_move_values_in_order(Btree *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>, Btree = const phmap::priv::btree<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>]"
                 );
  }
  cVar12 = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
           ::end((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                  *)&random_values);
  if (cVar12.node ==
      (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
       *)btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
         ::EmptyNode()::empty_node && cVar12.position == 0) {
    local_138._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_0017383b:
    local_140.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&duplicate_values,"b1.size()","0",(unsigned_long *)&local_138,
               (int *)&local_140);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2c2,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    local_138._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_140.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&duplicate_values,"b2.size()","0",(unsigned_long *)&local_138,
               (int *)&local_140);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2c3,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&duplicate_values,"bytes1","original_bytes1",(long *)&identical_values,
               &original_bytes1);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2c4,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    for (iVar9 = 1; iVar9 != 1000; iVar9 = iVar9 + 1) {
      duplicate_values.
      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ =
           Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>::operator()
                     ((Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_> *)
                      &sorted_values,iVar9);
      btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
      ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                *)&container,(value_type *)&duplicate_values);
    }
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&duplicate_values,"bytes2","bytes1",&bytes2,(long *)&identical_values);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2cb,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
             *)&random_values);
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
             *)&container);
    PVar4 = allocator1;
    PVar3 = allocator2;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
          )btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
           ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.rightmost_ =
         (node_type *)
         allocator1.
         super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
         .bytes_used_;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.size_ = (size_type)
                   btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                   ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .const_tree_ = (btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                    *)0x0;
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                  ::EmptyNode()::empty_node;
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)allocator2.
                  super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                  .bytes_used_;
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                  ::EmptyNode()::empty_node;
    original_bytes1 =
         (int64_t)identical_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    duplicate_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._0_16_ =
         Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>::operator()
                   ((Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_> *)
                    &sorted_values,0);
    btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
              *)&container,(value_type *)&duplicate_values);
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&duplicate_values,"bytes1","original_bytes1",(long *)&identical_values,
               &original_bytes1);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2d5,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
             *)&container);
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)container.
                  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                  .tree_.
                  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .tree_.size_;
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)container.
                  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                  .tree_.
                  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .tree_.rightmost_;
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)container.
                  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                  .tree_.
                  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .tree_.root_;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.rightmost_ =
         (node_type *)
         PVar3.
         super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
         .bytes_used_;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
          )btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
           ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.size_ = (size_type)
                   btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                   ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .const_tree_ = (btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                    *)0x0;
    local_138._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_140.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&duplicate_values,"b1.size()","0",(unsigned_long *)&local_138,
               (int *)&local_140);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2d9,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&duplicate_values,"bytes1","original_bytes1",(long *)&identical_values,
               &original_bytes1);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2da,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    for (iVar9 = 1; iVar9 != 1000; iVar9 = iVar9 + 1) {
      duplicate_values.
      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ =
           Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>::operator()
                     ((Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_> *)
                      &sorted_values,iVar9);
      btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
      ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                *)&container,(value_type *)&duplicate_values);
    }
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&duplicate_values,"bytes2","bytes1",&bytes2,(long *)&identical_values);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2e1,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
             *)&random_values);
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
             *)&container);
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
          )btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
           ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.rightmost_ =
         (node_type *)
         PVar4.
         super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
         .bytes_used_;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.size_ = (size_type)
                   btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                   ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .const_tree_ = (btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                    *)0x0;
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                  ::EmptyNode()::empty_node;
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)PVar3.
                  super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                  .bytes_used_;
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                  ::EmptyNode()::empty_node;
    original_bytes1 =
         (int64_t)identical_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    duplicate_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._0_16_ =
         Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>::operator()
                   ((Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_> *)
                    &sorted_values,0);
    btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
              *)&container,(value_type *)&duplicate_values);
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&duplicate_values,"bytes1","original_bytes1",(long *)&identical_values,
               &original_bytes1);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2eb,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    pbVar2 = container.
             super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
             .const_tree_;
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)container.
                  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                  .tree_.
                  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .tree_.size_;
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)container.
                  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                  .tree_.
                  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .tree_.rightmost_;
    random_values.
    super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)container.
                  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                  .tree_.
                  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .
                  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                  .tree_.root_;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.rightmost_ =
         (node_type *)
         PVar3.
         super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
         .bytes_used_;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
          )btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
           ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .tree_.
    super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
    .tree_.size_ = (size_type)
                   btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                   ::EmptyNode()::empty_node;
    container.
    super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    .const_tree_ = (btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                    *)0x0;
    local_138._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_140.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&duplicate_values,"b1.size()","0",(unsigned_long *)&local_138,
               (int *)&local_140);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2ef,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    local_138._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2;
    local_140.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&duplicate_values,"b2.size()","1",(unsigned_long *)&local_138,
               (int *)&local_140);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2f0,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&duplicate_values,"bytes1","original_bytes1",(long *)&identical_values,
               &original_bytes1);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2f1,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    for (iVar9 = 1; iVar9 != 1000; iVar9 = iVar9 + 1) {
      duplicate_values.
      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ =
           Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>::operator()
                     ((Generator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_> *)
                      &sorted_values,iVar9);
      btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
      ::insert((btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                *)&container,(value_type *)&duplicate_values);
    }
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&duplicate_values,"bytes2","bytes1",&bytes2,(long *)&identical_values);
    if ((char)duplicate_values.
              super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_138);
      if (duplicate_values.
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pVar10 = (pair<int,_int>)0x415b6f;
      }
      else {
        pVar10 = (duplicate_values.
                  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->first;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x2f8,(char *)pVar10);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      if (local_138._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_138._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&duplicate_values.
                      super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
             *)&random_values);
    btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
    ::clear((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
             *)&container);
    CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    ::deallocate(&allocator1.
                  super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                 ,p,n);
    CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
    ::deallocate(&allocator2.
                  super_CountingAllocator<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                 ,p_00,n_00);
    return;
  }
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .tree_.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
        )btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
         ::new_leaf_root_node
                   ((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                     *)&container,1);
  container.
  super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
  .tree_.
  super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
  .tree_.size_ = (size_type)
                 container.
                 super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
                 .tree_.
                 super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                 .
                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                 .
                 super_btree_container<phmap::priv::btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_>
                 .tree_.root_.
                 super__Tuple_impl<0UL,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
                 .
                 super__Tuple_impl<1UL,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
                 .
                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*>
                 .
                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>_*,_false>
                 ._M_head_impl;
  iVar13 = btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
           ::internal_upper_bound<std::pair<int,int>>
                     ((btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                       *)&container,
                      (pair<int,_int> *)
                      (btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                       ::EmptyNode()::empty_node + 0xc));
  if (iVar13.node ==
      (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
       *)0x0) {
    iVar13 = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
             ::end((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                    *)&container);
  }
  btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
  ::internal_emplace<std::pair<std::pair<int,int>const,std::pair<int,int>>const&>
            ((btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
              *)&container,iVar13,
             (pair<const_std::pair<int,_int>,_std::pair<int,_int>_> *)
             (btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
              ::EmptyNode()::empty_node + 0xc));
  uVar11 = 0;
  do {
    bVar5 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
            ::leaf((btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                    *)this_01);
    if (bVar5) {
      uVar11 = uVar11 + 1;
      bVar6 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
              ::count((btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                       *)this_01);
      if ((int)(uint)bVar6 <= (int)uVar11) goto LAB_00173721;
    }
    else {
LAB_00173721:
      bVar5 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
              ::leaf((btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                      *)this_01);
      bVar6 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
              ::count((btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                       *)this_01);
      if (bVar5) {
        this_00 = (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                   *)this_01;
        uVar8 = uVar11;
        if ((int)uVar11 < (int)(uint)bVar6) {
          __assert_fail("position >= node->count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x972,
                        "void phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>, const std::pair<const std::pair<int, int>, std::pair<int, int>> &, const std::pair<const std::pair<int, int>, std::pair<int, int>> *>::increment_slow() [Node = const phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>, Reference = const std::pair<const std::pair<int, int>, std::pair<int, int>> &, Pointer = const std::pair<const std::pair<int, int>, std::pair<int, int>> *]"
                       );
        }
        while ((bVar6 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                        ::count(this_00), uVar8 == bVar6 &&
               (bVar5 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                        ::is_root(this_00), !bVar5))) {
          pbVar7 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                   ::parent(this_00);
          bVar6 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                  ::position(this_00);
          pbVar7 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                   ::child(pbVar7,(ulong)bVar6);
          if (pbVar7 != this_00) {
            __assert_fail("node->parent()->child(node->position()) == node",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x975,
                          "void phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>, const std::pair<const std::pair<int, int>, std::pair<int, int>> &, const std::pair<const std::pair<int, int>, std::pair<int, int>> *>::increment_slow() [Node = const phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>, Reference = const std::pair<const std::pair<int, int>, std::pair<int, int>> &, Pointer = const std::pair<const std::pair<int, int>, std::pair<int, int>> *]"
                         );
          }
          bVar6 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                  ::position(this_00);
          uVar8 = (uint)bVar6;
          this_00 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                    ::parent(this_00);
        }
        bVar6 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                ::count(this_00);
        if (uVar8 != bVar6) {
          this_01 = this_00;
          uVar11 = uVar8;
        }
      }
      else {
        if ((int)(uint)bVar6 <= (int)uVar11) {
          __assert_fail("position < node->count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x97d,
                        "void phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>, const std::pair<const std::pair<int, int>, std::pair<int, int>> &, const std::pair<const std::pair<int, int>, std::pair<int, int>> *>::increment_slow() [Node = const phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>, Reference = const std::pair<const std::pair<int, int>, std::pair<int, int>> &, Pointer = const std::pair<const std::pair<int, int>, std::pair<int, int>> *]"
                       );
        }
        i_00 = (size_type)(int)(uVar11 + 1);
        while( true ) {
          this_01 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                    ::child((btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                             *)this_01,i_00);
          bVar5 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                  ::leaf((btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                          *)this_01);
          if (bVar5) break;
          i_00 = 0;
        }
        uVar11 = 0;
      }
    }
    cVar12 = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
             ::end((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                    *)&random_values);
    local_138._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         container.
         super_base_checker<phmap::btree_multimap<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>,_std::multimap<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
         .const_tree_;
    if (uVar11 == cVar12.position &&
        (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
         *)this_01 == cVar12.node) goto LAB_0017383b;
    iVar13 = btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
             ::end((btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                    *)&container);
    args = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
           ::slot((btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                   *)this_01,(long)(int)uVar11);
    iter._12_4_ = 0;
    iter.node = (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                 *)SUB128(iVar13._0_12_,0);
    iter.position = SUB124(iVar13._0_12_,8);
    btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
    ::internal_emplace<std::pair<std::pair<int,int>const,std::pair<int,int>>const&>
              ((btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                *)&container,iter,&args->value);
  } while( true );
}

Assistant:

void BtreeMultiTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        multi_checker<T, C> container;

        // Test keys in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test keys in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test keys in random order.
        DoTest("random:    ", &container, random_values);

        // Test keys in random order w/ duplicates.
        std::vector<V> duplicate_values(random_values);
        duplicate_values.insert(duplicate_values.end(), random_values.begin(),
                                random_values.end());
        DoTest("duplicates:", &container, duplicate_values);

        // Test all identical keys.
        std::vector<V> identical_values(100);
        std::fill(identical_values.begin(), identical_values.end(),
                  Generator<V>(2)(2));
        DoTest("identical: ", &container, identical_values);
    }